

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O3

void ps_astar_finish(ps_astar_t *nbest)

{
  glist_t pgVar1;
  
  pgVar1 = nbest->hyps;
  if (pgVar1 == (glist_t)0x0) {
    pgVar1 = (glist_t)0x0;
  }
  else {
    do {
      ckd_free((pgVar1->data).ptr);
      pgVar1 = pgVar1->next;
    } while (pgVar1 != (gnode_s *)0x0);
    pgVar1 = nbest->hyps;
  }
  glist_free(pgVar1);
  listelem_alloc_free(nbest->latpath_alloc);
  ckd_free(nbest);
  return;
}

Assistant:

void
ps_astar_finish(ps_astar_t *nbest)
{
    gnode_t *gn;

    /* Free all hyps. */
    for (gn = nbest->hyps; gn; gn = gnode_next(gn)) {
        ckd_free(gnode_ptr(gn));
    }
    glist_free(nbest->hyps);
    /* Free all paths. */
    listelem_alloc_free(nbest->latpath_alloc);
    /* Free the Henge. */
    ckd_free(nbest);
}